

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,char *filename,bool noPolicyScope)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  cmMessenger *messenger;
  cmListFile listFile;
  IncludeScope incScope;
  string filenametoread;
  allocator local_69;
  string local_68;
  IncludeScope local_48;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"CMAKE_CURRENT_LIST_FILE",&local_69);
  pcVar3 = GetDefinition(this,&local_68);
  AddDefinition(this,&local_38,pcVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_68,filename,(allocator *)&local_48);
  pcVar3 = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath(&local_38,&local_68,pcVar3);
  std::__cxx11::string::~string((string *)&local_68);
  IncludeScope::IncludeScope(&local_48,this,&local_38,noPolicyScope);
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile
                    ((cmListFile *)&local_68,local_38._M_dataplus._M_p,messenger,&this->Backtrace);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&local_68,&local_38);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    if (bVar2) {
      local_48.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_68);
  IncludeScope::~IncludeScope(&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadDependentFile(const char* filename, bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    incScope.Quiet();
  }
  return true;
}